

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Optional<Corrade::Containers::String> * Corrade::Utility::Path::homeDirectory(void)

{
  Optional<Corrade::Containers::String> *in_RDI;
  String local_70;
  Flags local_41;
  Error local_40;
  char *local_18;
  char *h;
  
  local_18 = getenv("HOME");
  if (local_18 == (char *)0x0) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Error::Error(&local_40,local_41);
    Debug::operator<<(&local_40.super_Debug,"Utility::Path::homeDirectory(): $HOME not available");
    Error::~Error(&local_40);
    Containers::Optional<Corrade::Containers::String>::Optional(in_RDI);
  }
  else {
    Containers::String::String<const_char_*,_0>(&local_70,local_18);
    Containers::Optional<Corrade::Containers::String>::Optional(in_RDI,&local_70);
    Containers::String::~String(&local_70);
  }
  return in_RDI;
}

Assistant:

Containers::Optional<Containers::String> homeDirectory() {
    /* Unix, Emscripten */
    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    const char* const h = std::getenv("HOME");
    if(!h) {
        Error{} << "Utility::Path::homeDirectory(): $HOME not available";
        return {};
    }

    return Containers::String{h};

    /* Windows (not Store/Phone) */
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    wchar_t* h = nullptr;
    Containers::ScopeGuard guard{h,
        #ifdef CORRADE_MSVC2015_COMPATIBILITY
        /* MSVC 2015 is unable to cast the parameter for CoTaskMemFree */
        [](wchar_t* path){ CoTaskMemFree(path); }
        #else
        CoTaskMemFree
        #endif
    };
    /* There doesn't seem to be any possibility how this could fail, so just
       assert */
    CORRADE_INTERNAL_ASSERT(SHGetKnownFolderPath(FOLDERID_Documents, KF_FLAG_DEFAULT, nullptr, &h) == S_OK);
    return fromNativeSeparators(Unicode::narrow(h));

    /* Other */
    #else
    Error{} << "Utility::Path::homeDirectory(): not implemented on this platform";
    return {};
    #endif
}